

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOAnalyzer.cpp
# Opt level: O0

void __thiscall MDIOAnalyzer::SetupResults(MDIOAnalyzer *this)

{
  MDIOAnalyzerResults *this_00;
  element_type *settings;
  element_type *peVar1;
  MDIOAnalyzer *this_local;
  
  this_00 = (MDIOAnalyzerResults *)operator_new(0x20);
  settings = std::auto_ptr<MDIOAnalyzerSettings>::get(&this->mSettings);
  MDIOAnalyzerResults::MDIOAnalyzerResults(this_00,this,settings);
  std::auto_ptr<MDIOAnalyzerResults>::reset(&this->mResults,this_00);
  std::auto_ptr<MDIOAnalyzerResults>::get(&this->mResults);
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  peVar1 = std::auto_ptr<MDIOAnalyzerResults>::operator->(&this->mResults);
  std::auto_ptr<MDIOAnalyzerSettings>::operator->(&this->mSettings);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)peVar1);
  return;
}

Assistant:

void MDIOAnalyzer::SetupResults()
{
    mResults.reset( new MDIOAnalyzerResults( this, mSettings.get() ) );
    SetAnalyzerResults( mResults.get() );
    mResults->AddChannelBubblesWillAppearOn( mSettings->mMdioChannel );
}